

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nukedopl3.cpp
# Opt level: O2

Bit16s envelope_calcsin5(Bit16u phase,Bit16u envelope)

{
  Bit16s BVar1;
  uint uVar2;
  uint uVar3;
  uint uVar4;
  
  uVar4 = phase & 0x3ff;
  uVar2 = 0x1000;
  if ((ushort)uVar4 < 0x200) {
    uVar3 = uVar4 * 2 & 0xff;
    uVar2 = uVar3 ^ 0xfe;
    if (-1 < (char)uVar4) {
      uVar2 = uVar3;
    }
    uVar2 = (uint)logsinrom[uVar2];
  }
  BVar1 = envelope_calcexp(uVar2 + (uint)envelope * 8);
  return BVar1;
}

Assistant:

Bit16s envelope_calcsin5(Bit16u phase, Bit16u envelope) {
	phase &= 0x3ff;
	Bit16u out = 0;
	if (phase & 0x200) {
		out = 0x1000;
	}
	else if (phase & 0x80) {
		out = logsinrom[((phase ^ 0xff) << 1) & 0xff];
	}
	else {
		out = logsinrom[(phase << 1) & 0xff];
	}
	return envelope_calcexp(out + (envelope << 3));
}